

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O3

_Bool math_min(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  int iVar1;
  undefined6 in_register_00000012;
  ulong uVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  bool bVar4;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 *paVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  gravity_value_t value;
  gravity_class_t *pgVar5;
  
  iVar1 = (int)CONCAT62(in_register_00000012,nargs);
  if ((iVar1 != 0) && (iVar1 != 1)) {
    paVar6 = &args[1].field_1;
    uVar2 = 1;
    dVar8 = 1.79769313486232e+308;
    uVar7 = 1;
    bVar4 = false;
    do {
      dVar9 = paVar6->f;
      if (((gravity_value_t *)(paVar6 + -1))->isa == gravity_class_int) {
        dVar9 = (double)(long)dVar9;
LAB_00140c52:
        bVar4 = true;
        if (dVar9 < dVar8) {
          uVar2 = uVar7 & 0xffffffff;
          dVar8 = dVar9;
        }
      }
      else if (((gravity_value_t *)(paVar6 + -1))->isa == gravity_class_float) goto LAB_00140c52;
      uVar7 = uVar7 + 1;
      paVar6 = paVar6 + 2;
    } while (nargs != uVar7);
    if (bVar4) {
      uVar2 = (ulong)(((uint)uVar2 & 0xffff) << 4);
      aVar3 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&args->field_1 + uVar2))->n;
      pgVar5 = *(gravity_class_t **)((long)&args->isa + uVar2);
      goto LAB_00140c99;
    }
  }
  aVar3.n = 0;
  pgVar5 = gravity_class_null;
LAB_00140c99:
  value.field_1.n = aVar3.n;
  value.isa = pgVar5;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_min (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs == 1) RETURN_VALUE(VALUE_FROM_NULL, rindex);

    gravity_float_t n = GRAVITY_FLOAT_MAX;
    uint16_t minindex = 1;
    bool found = false;

    for (uint16_t i = 1; i<nargs; ++i) {
        gravity_value_t value = GET_VALUE(i);
        if (VALUE_ISA_INT(value)) {
            found = true;
            if ((gravity_float_t)value.n < n) {
                n = (gravity_float_t)value.n;
                minindex = i;
            }
        } else if (VALUE_ISA_FLOAT(value)) {
            found = true;
            if (value.f < n) {
                n = value.f;
                minindex = i;
            }
        } else continue;
    }

    if (!found) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }

    RETURN_VALUE(GET_VALUE(minindex), rindex);
}